

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O3

uint32_t blockmix_xor_save(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r,
                          pwxform_ctx_t *ctx)

{
  salsa20_blk_t *psVar1;
  salsa20_blk_t *psVar2;
  uint32_t *puVar3;
  int *piVar4;
  uint8_t *puVar5;
  long lVar6;
  uint8_t *puVar7;
  size_t sVar8;
  ulong uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *puVar12;
  __m128i Y2;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i Y1;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i Y3;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar72;
  int iVar73;
  __m128i Y0;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar74;
  int iVar75;
  int iVar95;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar96;
  uint uVar110;
  uint uVar111;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar112;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  uint uVar113;
  uint32_t uVar114;
  uint uVar127;
  uint uVar128;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  uint uVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int iVar129;
  int iVar131;
  undefined1 auVar126 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  int iVar137;
  int iVar140;
  int iVar141;
  undefined1 auVar138 [16];
  int iVar142;
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  
  sVar8 = ctx->w;
  lVar6 = r * 2 + -1;
  psVar1 = Bin2 + lVar6;
  psVar2 = Bin1 + lVar6;
  do {
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  auVar58 = (undefined1  [16])psVar1->q[0] ^ (undefined1  [16])psVar2->q[0];
  auVar25 = (undefined1  [16])psVar1->q[1] ^ (undefined1  [16])psVar2->q[1];
  auVar13 = (undefined1  [16])psVar1->q[2] ^ (undefined1  [16])psVar2->q[2];
  auVar41 = (undefined1  [16])psVar1->q[3] ^ (undefined1  [16])psVar2->q[3];
  lVar6 = 0x70;
  uVar9 = 0;
  puVar5 = ctx->S0;
  puVar7 = ctx->S2;
  puVar12 = ctx->S1;
  while( true ) {
    puVar10 = puVar7;
    puVar7 = puVar5;
    auVar115 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x70) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x70);
    auVar132 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x60) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x60);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x70) = auVar115;
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x60) = auVar132;
    auVar97 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x50) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x50);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x50) = auVar97;
    auVar76 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x40) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x40);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x40) = auVar76;
    auVar115 = auVar115 ^ auVar58;
    uVar96 = auVar115._4_4_;
    auVar59._4_4_ = uVar96;
    auVar59._0_4_ = uVar96;
    auVar59._8_4_ = auVar115._12_4_;
    auVar59._12_4_ = auVar115._12_4_;
    auVar60._0_8_ =
         (ulong)uVar96 * (ulong)auVar115._0_4_ + *(long *)(puVar7 + (auVar115._0_8_ & 0xff0));
    auVar60._8_8_ =
         (auVar59._8_8_ & 0xffffffff) * (ulong)auVar115._8_4_ +
         *(long *)((long)(puVar7 + (auVar115._0_8_ & 0xff0)) + 8);
    auVar60 = auVar60 ^ *(undefined1 (*) [16])(puVar12 + (auVar115._0_8_ >> 0x20 & 0xff0));
    auVar132 = auVar132 ^ auVar25;
    uVar96 = auVar132._4_4_;
    auVar116._4_4_ = uVar96;
    auVar116._0_4_ = uVar96;
    auVar116._8_4_ = auVar132._12_4_;
    auVar116._12_4_ = auVar132._12_4_;
    auVar117._0_8_ =
         (ulong)uVar96 * (ulong)auVar132._0_4_ + *(long *)(puVar7 + (auVar132._0_8_ & 0xff0));
    auVar117._8_8_ =
         (auVar116._8_8_ & 0xffffffff) * (ulong)auVar132._8_4_ +
         *(long *)((long)(puVar7 + (auVar132._0_8_ & 0xff0)) + 8);
    auVar117 = auVar117 ^ *(undefined1 (*) [16])(puVar12 + (auVar132._0_8_ >> 0x20 & 0xff0));
    auVar97 = auVar97 ^ auVar13;
    uVar96 = auVar97._4_4_;
    auVar133._4_4_ = uVar96;
    auVar133._0_4_ = uVar96;
    auVar133._8_4_ = auVar97._12_4_;
    auVar133._12_4_ = auVar97._12_4_;
    auVar134._0_8_ =
         (ulong)uVar96 * (ulong)auVar97._0_4_ + *(long *)(puVar7 + (auVar97._0_8_ & 0xff0));
    auVar134._8_8_ =
         (auVar133._8_8_ & 0xffffffff) * (ulong)auVar97._8_4_ +
         *(long *)((long)(puVar7 + (auVar97._0_8_ & 0xff0)) + 8);
    auVar134 = auVar134 ^ *(undefined1 (*) [16])(puVar12 + (auVar97._0_8_ >> 0x20 & 0xff0));
    auVar76 = auVar76 ^ auVar41;
    uVar96 = auVar76._4_4_;
    auVar98._4_4_ = uVar96;
    auVar98._0_4_ = uVar96;
    auVar98._8_4_ = auVar76._12_4_;
    auVar98._12_4_ = auVar76._12_4_;
    auVar99._0_8_ =
         (ulong)uVar96 * (ulong)auVar76._0_4_ + *(long *)(puVar7 + (auVar76._0_8_ & 0xff0));
    auVar99._8_8_ =
         (auVar98._8_8_ & 0xffffffff) * (ulong)auVar76._8_4_ +
         *(long *)((long)(puVar7 + (auVar76._0_8_ & 0xff0)) + 8);
    auVar99 = auVar99 ^ *(undefined1 (*) [16])(puVar12 + (auVar76._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar60._4_4_;
    auVar76._4_4_ = uVar96;
    auVar76._0_4_ = uVar96;
    auVar76._8_4_ = auVar60._12_4_;
    auVar76._12_4_ = auVar60._12_4_;
    auVar97._0_8_ =
         (ulong)uVar96 * (ulong)auVar60._0_4_ + *(long *)(puVar7 + (auVar60._0_8_ & 0xff0));
    auVar97._8_8_ =
         (auVar76._8_8_ & 0xffffffff) * (ulong)auVar60._8_4_ +
         *(long *)((long)(puVar7 + (auVar60._0_8_ & 0xff0)) + 8);
    auVar97 = auVar97 ^ *(undefined1 (*) [16])(puVar12 + (auVar60._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar117._4_4_;
    auVar26._4_4_ = uVar96;
    auVar26._0_4_ = uVar96;
    auVar26._8_4_ = auVar117._12_4_;
    auVar26._12_4_ = auVar117._12_4_;
    auVar27._0_8_ =
         (ulong)uVar96 * (ulong)auVar117._0_4_ + *(long *)(puVar7 + (auVar117._0_8_ & 0xff0));
    auVar27._8_8_ =
         (auVar26._8_8_ & 0xffffffff) * (ulong)auVar117._8_4_ +
         *(long *)((long)(puVar7 + (auVar117._0_8_ & 0xff0)) + 8);
    auVar27 = auVar27 ^ *(undefined1 (*) [16])(puVar12 + (auVar117._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar134._4_4_;
    auVar42._4_4_ = uVar96;
    auVar42._0_4_ = uVar96;
    auVar42._8_4_ = auVar134._12_4_;
    auVar42._12_4_ = auVar134._12_4_;
    auVar43._0_8_ =
         (ulong)uVar96 * (ulong)auVar134._0_4_ + *(long *)(puVar7 + (auVar134._0_8_ & 0xff0));
    auVar43._8_8_ =
         (auVar42._8_8_ & 0xffffffff) * (ulong)auVar134._8_4_ +
         *(long *)((long)(puVar7 + (auVar134._0_8_ & 0xff0)) + 8);
    auVar43 = auVar43 ^ *(undefined1 (*) [16])(puVar12 + (auVar134._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar99._4_4_;
    auVar61._4_4_ = uVar96;
    auVar61._0_4_ = uVar96;
    auVar61._8_4_ = auVar99._12_4_;
    auVar61._12_4_ = auVar99._12_4_;
    auVar62._0_8_ =
         (ulong)uVar96 * (ulong)auVar99._0_4_ + *(long *)(puVar7 + (auVar99._0_8_ & 0xff0));
    auVar62._8_8_ =
         (auVar61._8_8_ & 0xffffffff) * (ulong)auVar99._8_4_ +
         *(long *)((long)(puVar7 + (auVar99._0_8_ & 0xff0)) + 8);
    auVar62 = auVar62 ^ *(undefined1 (*) [16])(puVar12 + (auVar99._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8) = auVar97;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x10) = auVar27;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x20) = auVar43;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x30) = auVar62;
    uVar96 = auVar97._4_4_;
    auVar77._4_4_ = uVar96;
    auVar77._0_4_ = uVar96;
    auVar77._8_4_ = auVar97._12_4_;
    auVar77._12_4_ = auVar97._12_4_;
    auVar78._0_8_ =
         (ulong)uVar96 * (ulong)auVar97._0_4_ + *(long *)(puVar7 + (auVar97._0_8_ & 0xff0));
    auVar78._8_8_ =
         (auVar77._8_8_ & 0xffffffff) * (ulong)auVar97._8_4_ +
         *(long *)((long)(puVar7 + (auVar97._0_8_ & 0xff0)) + 8);
    auVar78 = auVar78 ^ *(undefined1 (*) [16])(puVar12 + (auVar97._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar27._4_4_;
    auVar115._4_4_ = uVar96;
    auVar115._0_4_ = uVar96;
    auVar115._8_4_ = auVar27._12_4_;
    auVar115._12_4_ = auVar27._12_4_;
    auVar132._0_8_ =
         (ulong)uVar96 * (ulong)auVar27._0_4_ + *(long *)(puVar7 + (auVar27._0_8_ & 0xff0));
    auVar132._8_8_ =
         (auVar115._8_8_ & 0xffffffff) * (ulong)auVar27._8_4_ +
         *(long *)((long)(puVar7 + (auVar27._0_8_ & 0xff0)) + 8);
    auVar132 = auVar132 ^ *(undefined1 (*) [16])(puVar12 + (auVar27._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar43._4_4_;
    auVar28._4_4_ = uVar96;
    auVar28._0_4_ = uVar96;
    auVar28._8_4_ = auVar43._12_4_;
    auVar28._12_4_ = auVar43._12_4_;
    auVar29._0_8_ =
         (ulong)uVar96 * (ulong)auVar43._0_4_ + *(long *)(puVar7 + (auVar43._0_8_ & 0xff0));
    auVar29._8_8_ =
         (auVar28._8_8_ & 0xffffffff) * (ulong)auVar43._8_4_ +
         *(long *)((long)(puVar7 + (auVar43._0_8_ & 0xff0)) + 8);
    auVar29 = auVar29 ^ *(undefined1 (*) [16])(puVar12 + (auVar43._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar62._4_4_;
    auVar44._4_4_ = uVar96;
    auVar44._0_4_ = uVar96;
    auVar44._8_4_ = auVar62._12_4_;
    auVar44._12_4_ = auVar62._12_4_;
    auVar45._0_8_ =
         (ulong)uVar96 * (ulong)auVar62._0_4_ + *(long *)(puVar7 + (auVar62._0_8_ & 0xff0));
    auVar45._8_8_ =
         (auVar44._8_8_ & 0xffffffff) * (ulong)auVar62._8_4_ +
         *(long *)((long)(puVar7 + (auVar62._0_8_ & 0xff0)) + 8);
    auVar45 = auVar45 ^ *(undefined1 (*) [16])(puVar12 + (auVar62._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x40) = auVar78;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x50) = auVar132;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x60) = auVar29;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x70) = auVar45;
    uVar96 = auVar78._4_4_;
    auVar63._4_4_ = uVar96;
    auVar63._0_4_ = uVar96;
    auVar63._8_4_ = auVar78._12_4_;
    auVar63._12_4_ = auVar78._12_4_;
    auVar64._0_8_ =
         (ulong)uVar96 * (ulong)auVar78._0_4_ + *(long *)(puVar7 + (auVar78._0_8_ & 0xff0));
    auVar64._8_8_ =
         (auVar63._8_8_ & 0xffffffff) * (ulong)auVar78._8_4_ +
         *(long *)((long)(puVar7 + (auVar78._0_8_ & 0xff0)) + 8);
    auVar64 = auVar64 ^ *(undefined1 (*) [16])(puVar12 + (auVar78._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar132._4_4_;
    auVar79._4_4_ = uVar96;
    auVar79._0_4_ = uVar96;
    auVar79._8_4_ = auVar132._12_4_;
    auVar79._12_4_ = auVar132._12_4_;
    auVar80._0_8_ =
         (ulong)uVar96 * (ulong)auVar132._0_4_ + *(long *)(puVar7 + (auVar132._0_8_ & 0xff0));
    auVar80._8_8_ =
         (auVar79._8_8_ & 0xffffffff) * (ulong)auVar132._8_4_ +
         *(long *)((long)(puVar7 + (auVar132._0_8_ & 0xff0)) + 8);
    auVar80 = auVar80 ^ *(undefined1 (*) [16])(puVar12 + (auVar132._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar29._4_4_;
    auVar100._4_4_ = uVar96;
    auVar100._0_4_ = uVar96;
    auVar100._8_4_ = auVar29._12_4_;
    auVar100._12_4_ = auVar29._12_4_;
    auVar101._0_8_ =
         (ulong)uVar96 * (ulong)auVar29._0_4_ + *(long *)(puVar7 + (auVar29._0_8_ & 0xff0));
    auVar101._8_8_ =
         (auVar100._8_8_ & 0xffffffff) * (ulong)auVar29._8_4_ +
         *(long *)((long)(puVar7 + (auVar29._0_8_ & 0xff0)) + 8);
    auVar101 = auVar101 ^ *(undefined1 (*) [16])(puVar12 + (auVar29._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar45._4_4_;
    auVar118._4_4_ = uVar96;
    auVar118._0_4_ = uVar96;
    auVar118._8_4_ = auVar45._12_4_;
    auVar118._12_4_ = auVar45._12_4_;
    auVar119._0_8_ =
         (ulong)uVar96 * (ulong)auVar45._0_4_ + *(long *)(puVar7 + (auVar45._0_8_ & 0xff0));
    auVar119._8_8_ =
         (auVar118._8_8_ & 0xffffffff) * (ulong)auVar45._8_4_ +
         *(long *)((long)(puVar7 + (auVar45._0_8_ & 0xff0)) + 8);
    auVar119 = auVar119 ^ *(undefined1 (*) [16])(puVar12 + (auVar45._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x80) = auVar64;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0x90) = auVar80;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xa0) = auVar101;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xb0) = auVar119;
    uVar96 = auVar64._4_4_;
    auVar14._4_4_ = uVar96;
    auVar14._0_4_ = uVar96;
    auVar14._8_4_ = auVar64._12_4_;
    auVar14._12_4_ = auVar64._12_4_;
    auVar15._0_8_ =
         (ulong)uVar96 * (ulong)auVar64._0_4_ + *(long *)(puVar7 + (auVar64._0_8_ & 0xff0));
    auVar15._8_8_ =
         (auVar14._8_8_ & 0xffffffff) * (ulong)auVar64._8_4_ +
         *(long *)((long)(puVar7 + (auVar64._0_8_ & 0xff0)) + 8);
    auVar15 = auVar15 ^ *(undefined1 (*) [16])(puVar12 + (auVar64._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar80._4_4_;
    auVar30._4_4_ = uVar96;
    auVar30._0_4_ = uVar96;
    auVar30._8_4_ = auVar80._12_4_;
    auVar30._12_4_ = auVar80._12_4_;
    auVar31._0_8_ =
         (ulong)uVar96 * (ulong)auVar80._0_4_ + *(long *)(puVar7 + (auVar80._0_8_ & 0xff0));
    auVar31._8_8_ =
         (auVar30._8_8_ & 0xffffffff) * (ulong)auVar80._8_4_ +
         *(long *)((long)(puVar7 + (auVar80._0_8_ & 0xff0)) + 8);
    auVar31 = auVar31 ^ *(undefined1 (*) [16])(puVar12 + (auVar80._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar101._4_4_;
    auVar65._4_4_ = uVar96;
    auVar65._0_4_ = uVar96;
    auVar65._8_4_ = auVar101._12_4_;
    auVar65._12_4_ = auVar101._12_4_;
    auVar66._0_8_ =
         (ulong)uVar96 * (ulong)auVar101._0_4_ + *(long *)(puVar7 + (auVar101._0_8_ & 0xff0));
    auVar66._8_8_ =
         (auVar65._8_8_ & 0xffffffff) * (ulong)auVar101._8_4_ +
         *(long *)((long)(puVar7 + (auVar101._0_8_ & 0xff0)) + 8);
    auVar66 = auVar66 ^ *(undefined1 (*) [16])(puVar12 + (auVar101._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar119._4_4_;
    auVar102._4_4_ = uVar96;
    auVar102._0_4_ = uVar96;
    auVar102._8_4_ = auVar119._12_4_;
    auVar102._12_4_ = auVar119._12_4_;
    auVar103._0_8_ =
         (ulong)uVar96 * (ulong)auVar119._0_4_ + *(long *)(puVar7 + (auVar119._0_8_ & 0xff0));
    auVar103._8_8_ =
         (auVar102._8_8_ & 0xffffffff) * (ulong)auVar119._8_4_ +
         *(long *)((long)(puVar7 + (auVar119._0_8_ & 0xff0)) + 8);
    auVar103 = auVar103 ^ *(undefined1 (*) [16])(puVar12 + (auVar119._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xc0) = auVar15;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xd0) = auVar31;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xe0) = auVar66;
    *(undefined1 (*) [16])(puVar10 + sVar8 + 0xf0) = auVar103;
    uVar96 = auVar15._4_4_;
    auVar81._4_4_ = uVar96;
    auVar81._0_4_ = uVar96;
    auVar81._8_4_ = auVar15._12_4_;
    auVar81._12_4_ = auVar15._12_4_;
    auVar82._0_8_ =
         (ulong)uVar96 * (ulong)auVar15._0_4_ + *(long *)(puVar7 + (auVar15._0_8_ & 0xff0));
    auVar82._8_8_ =
         (auVar81._8_8_ & 0xffffffff) * (ulong)auVar15._8_4_ +
         *(long *)((long)(puVar7 + (auVar15._0_8_ & 0xff0)) + 8);
    auVar13 = *(undefined1 (*) [16])(puVar12 + (auVar15._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar31._4_4_;
    auVar46._4_4_ = uVar96;
    auVar46._0_4_ = uVar96;
    auVar46._8_4_ = auVar31._12_4_;
    auVar46._12_4_ = auVar31._12_4_;
    auVar47._0_8_ =
         (ulong)uVar96 * (ulong)auVar31._0_4_ + *(long *)(puVar7 + (auVar31._0_8_ & 0xff0));
    auVar47._8_8_ =
         (auVar46._8_8_ & 0xffffffff) * (ulong)auVar31._8_4_ +
         *(long *)((long)(puVar7 + (auVar31._0_8_ & 0xff0)) + 8);
    auVar25 = *(undefined1 (*) [16])(puVar12 + (auVar31._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar66._4_4_;
    auVar32._4_4_ = uVar96;
    auVar32._0_4_ = uVar96;
    auVar32._8_4_ = auVar66._12_4_;
    auVar32._12_4_ = auVar66._12_4_;
    auVar33._0_8_ =
         (ulong)uVar96 * (ulong)auVar66._0_4_ + *(long *)(puVar7 + (auVar66._0_8_ & 0xff0));
    auVar33._8_8_ =
         (auVar32._8_8_ & 0xffffffff) * (ulong)auVar66._8_4_ +
         *(long *)((long)(puVar7 + (auVar66._0_8_ & 0xff0)) + 8);
    auVar41 = *(undefined1 (*) [16])(puVar12 + (auVar66._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar103._4_4_;
    auVar16._4_4_ = uVar96;
    auVar16._0_4_ = uVar96;
    auVar16._8_4_ = auVar103._12_4_;
    auVar16._12_4_ = auVar103._12_4_;
    auVar17._0_8_ =
         (ulong)uVar96 * (ulong)auVar103._0_4_ + *(long *)(puVar7 + (auVar103._0_8_ & 0xff0));
    auVar17._8_8_ =
         (auVar16._8_8_ & 0xffffffff) * (ulong)auVar103._8_4_ +
         *(long *)((long)(puVar7 + (auVar103._0_8_ & 0xff0)) + 8);
    auVar58 = *(undefined1 (*) [16])(puVar12 + (auVar103._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x70) = auVar82 ^ auVar13;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x60) = auVar47 ^ auVar25;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x50) = auVar33 ^ auVar41;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x40) = auVar17 ^ auVar58;
    auVar132 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x30) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x30);
    auVar115 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x20) ^
               *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x20);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x30) = auVar132;
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x20) = auVar115;
    auVar97 = *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x10) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6 + -0x10);
    *(undefined1 (*) [16])((long)Bin2 + lVar6 + -0x10) = auVar97;
    auVar76 = *(undefined1 (*) [16])((long)Bin2 + lVar6) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar6);
    *(undefined1 (*) [16])((long)Bin2 + lVar6) = auVar76;
    auVar132 = auVar132 ^ auVar82 ^ auVar13;
    uVar96 = auVar132._4_4_;
    auVar83._4_4_ = uVar96;
    auVar83._0_4_ = uVar96;
    auVar83._8_4_ = auVar132._12_4_;
    auVar83._12_4_ = auVar132._12_4_;
    auVar84._0_8_ =
         (ulong)uVar96 * (ulong)auVar132._0_4_ + *(long *)(puVar10 + (auVar132._0_8_ & 0xff0));
    auVar84._8_8_ =
         (auVar83._8_8_ & 0xffffffff) * (ulong)auVar132._8_4_ +
         *(long *)((long)(puVar10 + (auVar132._0_8_ & 0xff0)) + 8);
    auVar84 = auVar84 ^ *(undefined1 (*) [16])(puVar7 + (auVar132._0_8_ >> 0x20 & 0xff0));
    auVar115 = auVar115 ^ auVar47 ^ auVar25;
    uVar96 = auVar115._4_4_;
    auVar48._4_4_ = uVar96;
    auVar48._0_4_ = uVar96;
    auVar48._8_4_ = auVar115._12_4_;
    auVar48._12_4_ = auVar115._12_4_;
    auVar49._0_8_ =
         (ulong)uVar96 * (ulong)auVar115._0_4_ + *(long *)(puVar10 + (auVar115._0_8_ & 0xff0));
    auVar49._8_8_ =
         (auVar48._8_8_ & 0xffffffff) * (ulong)auVar115._8_4_ +
         *(long *)((long)(puVar10 + (auVar115._0_8_ & 0xff0)) + 8);
    auVar49 = auVar49 ^ *(undefined1 (*) [16])(puVar7 + (auVar115._0_8_ >> 0x20 & 0xff0));
    auVar97 = auVar97 ^ auVar33 ^ auVar41;
    uVar96 = auVar97._4_4_;
    auVar120._4_4_ = uVar96;
    auVar120._0_4_ = uVar96;
    auVar120._8_4_ = auVar97._12_4_;
    auVar120._12_4_ = auVar97._12_4_;
    auVar121._0_8_ =
         (ulong)uVar96 * (ulong)auVar97._0_4_ + *(long *)(puVar10 + (auVar97._0_8_ & 0xff0));
    auVar121._8_8_ =
         (auVar120._8_8_ & 0xffffffff) * (ulong)auVar97._8_4_ +
         *(long *)((long)(puVar10 + (auVar97._0_8_ & 0xff0)) + 8);
    auVar121 = auVar121 ^ *(undefined1 (*) [16])(puVar7 + (auVar97._0_8_ >> 0x20 & 0xff0));
    auVar76 = auVar76 ^ auVar17 ^ auVar58;
    uVar96 = auVar76._4_4_;
    auVar104._4_4_ = uVar96;
    auVar104._0_4_ = uVar96;
    auVar104._8_4_ = auVar76._12_4_;
    auVar104._12_4_ = auVar76._12_4_;
    auVar105._0_8_ =
         (ulong)uVar96 * (ulong)auVar76._0_4_ + *(long *)(puVar10 + (auVar76._0_8_ & 0xff0));
    auVar105._8_8_ =
         (auVar104._8_8_ & 0xffffffff) * (ulong)auVar76._8_4_ +
         *(long *)((long)(puVar10 + (auVar76._0_8_ & 0xff0)) + 8);
    auVar105 = auVar105 ^ *(undefined1 (*) [16])(puVar7 + (auVar76._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar84._4_4_;
    auVar18._4_4_ = uVar96;
    auVar18._0_4_ = uVar96;
    auVar18._8_4_ = auVar84._12_4_;
    auVar18._12_4_ = auVar84._12_4_;
    auVar19._0_8_ =
         (ulong)uVar96 * (ulong)auVar84._0_4_ + *(long *)(puVar10 + (auVar84._0_8_ & 0xff0));
    auVar19._8_8_ =
         (auVar18._8_8_ & 0xffffffff) * (ulong)auVar84._8_4_ +
         *(long *)((long)(puVar10 + (auVar84._0_8_ & 0xff0)) + 8);
    auVar19 = auVar19 ^ *(undefined1 (*) [16])(puVar7 + (auVar84._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar49._4_4_;
    auVar34._4_4_ = uVar96;
    auVar34._0_4_ = uVar96;
    auVar34._8_4_ = auVar49._12_4_;
    auVar34._12_4_ = auVar49._12_4_;
    auVar35._0_8_ =
         (ulong)uVar96 * (ulong)auVar49._0_4_ + *(long *)(puVar10 + (auVar49._0_8_ & 0xff0));
    auVar35._8_8_ =
         (auVar34._8_8_ & 0xffffffff) * (ulong)auVar49._8_4_ +
         *(long *)((long)(puVar10 + (auVar49._0_8_ & 0xff0)) + 8);
    auVar35 = auVar35 ^ *(undefined1 (*) [16])(puVar7 + (auVar49._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar121._4_4_;
    auVar50._4_4_ = uVar96;
    auVar50._0_4_ = uVar96;
    auVar50._8_4_ = auVar121._12_4_;
    auVar50._12_4_ = auVar121._12_4_;
    auVar51._0_8_ =
         (ulong)uVar96 * (ulong)auVar121._0_4_ + *(long *)(puVar10 + (auVar121._0_8_ & 0xff0));
    auVar51._8_8_ =
         (auVar50._8_8_ & 0xffffffff) * (ulong)auVar121._8_4_ +
         *(long *)((long)(puVar10 + (auVar121._0_8_ & 0xff0)) + 8);
    auVar51 = auVar51 ^ *(undefined1 (*) [16])(puVar7 + (auVar121._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar105._4_4_;
    auVar67._4_4_ = uVar96;
    auVar67._0_4_ = uVar96;
    auVar67._8_4_ = auVar105._12_4_;
    auVar67._12_4_ = auVar105._12_4_;
    auVar68._0_8_ =
         (ulong)uVar96 * (ulong)auVar105._0_4_ + *(long *)(puVar10 + (auVar105._0_8_ & 0xff0));
    auVar68._8_8_ =
         (auVar67._8_8_ & 0xffffffff) * (ulong)auVar105._8_4_ +
         *(long *)((long)(puVar10 + (auVar105._0_8_ & 0xff0)) + 8);
    auVar68 = auVar68 ^ *(undefined1 (*) [16])(puVar7 + (auVar105._0_8_ >> 0x20 & 0xff0));
    uVar11 = (ulong)((int)sVar8 + 0x100U & 0xff0);
    *(undefined1 (*) [16])(puVar12 + uVar11) = auVar19;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x10) = auVar35;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x20) = auVar51;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x30) = auVar68;
    uVar96 = auVar19._4_4_;
    auVar85._4_4_ = uVar96;
    auVar85._0_4_ = uVar96;
    auVar85._8_4_ = auVar19._12_4_;
    auVar85._12_4_ = auVar19._12_4_;
    auVar86._0_8_ =
         (ulong)uVar96 * (ulong)auVar19._0_4_ + *(long *)(puVar10 + (auVar19._0_8_ & 0xff0));
    auVar86._8_8_ =
         (auVar85._8_8_ & 0xffffffff) * (ulong)auVar19._8_4_ +
         *(long *)((long)(puVar10 + (auVar19._0_8_ & 0xff0)) + 8);
    auVar86 = auVar86 ^ *(undefined1 (*) [16])(puVar7 + (auVar19._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar35._4_4_;
    auVar20._4_4_ = uVar96;
    auVar20._0_4_ = uVar96;
    auVar20._8_4_ = auVar35._12_4_;
    auVar20._12_4_ = auVar35._12_4_;
    auVar21._0_8_ =
         (ulong)uVar96 * (ulong)auVar35._0_4_ + *(long *)(puVar10 + (auVar35._0_8_ & 0xff0));
    auVar21._8_8_ =
         (auVar20._8_8_ & 0xffffffff) * (ulong)auVar35._8_4_ +
         *(long *)((long)(puVar10 + (auVar35._0_8_ & 0xff0)) + 8);
    auVar21 = auVar21 ^ *(undefined1 (*) [16])(puVar7 + (auVar35._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar51._4_4_;
    auVar36._4_4_ = uVar96;
    auVar36._0_4_ = uVar96;
    auVar36._8_4_ = auVar51._12_4_;
    auVar36._12_4_ = auVar51._12_4_;
    auVar37._0_8_ =
         (ulong)uVar96 * (ulong)auVar51._0_4_ + *(long *)(puVar10 + (auVar51._0_8_ & 0xff0));
    auVar37._8_8_ =
         (auVar36._8_8_ & 0xffffffff) * (ulong)auVar51._8_4_ +
         *(long *)((long)(puVar10 + (auVar51._0_8_ & 0xff0)) + 8);
    auVar37 = auVar37 ^ *(undefined1 (*) [16])(puVar7 + (auVar51._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar68._4_4_;
    auVar52._4_4_ = uVar96;
    auVar52._0_4_ = uVar96;
    auVar52._8_4_ = auVar68._12_4_;
    auVar52._12_4_ = auVar68._12_4_;
    auVar53._0_8_ =
         (ulong)uVar96 * (ulong)auVar68._0_4_ + *(long *)(puVar10 + (auVar68._0_8_ & 0xff0));
    auVar53._8_8_ =
         (auVar52._8_8_ & 0xffffffff) * (ulong)auVar68._8_4_ +
         *(long *)((long)(puVar10 + (auVar68._0_8_ & 0xff0)) + 8);
    auVar53 = auVar53 ^ *(undefined1 (*) [16])(puVar7 + (auVar68._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x40) = auVar86;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x50) = auVar21;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x60) = auVar37;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x70) = auVar53;
    uVar96 = auVar86._4_4_;
    auVar69._4_4_ = uVar96;
    auVar69._0_4_ = uVar96;
    auVar69._8_4_ = auVar86._12_4_;
    auVar69._12_4_ = auVar86._12_4_;
    auVar70._0_8_ =
         (ulong)uVar96 * (ulong)auVar86._0_4_ + *(long *)(puVar10 + (auVar86._0_8_ & 0xff0));
    auVar70._8_8_ =
         (auVar69._8_8_ & 0xffffffff) * (ulong)auVar86._8_4_ +
         *(long *)((long)(puVar10 + (auVar86._0_8_ & 0xff0)) + 8);
    auVar70 = auVar70 ^ *(undefined1 (*) [16])(puVar7 + (auVar86._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar21._4_4_;
    auVar87._4_4_ = uVar96;
    auVar87._0_4_ = uVar96;
    auVar87._8_4_ = auVar21._12_4_;
    auVar87._12_4_ = auVar21._12_4_;
    auVar88._0_8_ =
         (ulong)uVar96 * (ulong)auVar21._0_4_ + *(long *)(puVar10 + (auVar21._0_8_ & 0xff0));
    auVar88._8_8_ =
         (auVar87._8_8_ & 0xffffffff) * (ulong)auVar21._8_4_ +
         *(long *)((long)(puVar10 + (auVar21._0_8_ & 0xff0)) + 8);
    auVar88 = auVar88 ^ *(undefined1 (*) [16])(puVar7 + (auVar21._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar37._4_4_;
    auVar106._4_4_ = uVar96;
    auVar106._0_4_ = uVar96;
    auVar106._8_4_ = auVar37._12_4_;
    auVar106._12_4_ = auVar37._12_4_;
    auVar107._0_8_ =
         (ulong)uVar96 * (ulong)auVar37._0_4_ + *(long *)(puVar10 + (auVar37._0_8_ & 0xff0));
    auVar107._8_8_ =
         (auVar106._8_8_ & 0xffffffff) * (ulong)auVar37._8_4_ +
         *(long *)((long)(puVar10 + (auVar37._0_8_ & 0xff0)) + 8);
    auVar107 = auVar107 ^ *(undefined1 (*) [16])(puVar7 + (auVar37._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar53._4_4_;
    auVar122._4_4_ = uVar96;
    auVar122._0_4_ = uVar96;
    auVar122._8_4_ = auVar53._12_4_;
    auVar122._12_4_ = auVar53._12_4_;
    auVar123._0_8_ =
         (ulong)uVar96 * (ulong)auVar53._0_4_ + *(long *)(puVar10 + (auVar53._0_8_ & 0xff0));
    auVar123._8_8_ =
         (auVar122._8_8_ & 0xffffffff) * (ulong)auVar53._8_4_ +
         *(long *)((long)(puVar10 + (auVar53._0_8_ & 0xff0)) + 8);
    auVar123 = auVar123 ^ *(undefined1 (*) [16])(puVar7 + (auVar53._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x80) = auVar70;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0x90) = auVar88;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xa0) = auVar107;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xb0) = auVar123;
    uVar96 = auVar70._4_4_;
    auVar38._4_4_ = uVar96;
    auVar38._0_4_ = uVar96;
    auVar38._8_4_ = auVar70._12_4_;
    auVar38._12_4_ = auVar70._12_4_;
    auVar39._0_8_ =
         (ulong)uVar96 * (ulong)auVar70._0_4_ + *(long *)(puVar10 + (auVar70._0_8_ & 0xff0));
    auVar39._8_8_ =
         (auVar38._8_8_ & 0xffffffff) * (ulong)auVar70._8_4_ +
         *(long *)((long)(puVar10 + (auVar70._0_8_ & 0xff0)) + 8);
    auVar39 = auVar39 ^ *(undefined1 (*) [16])(puVar7 + (auVar70._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar88._4_4_;
    auVar22._4_4_ = uVar96;
    auVar22._0_4_ = uVar96;
    auVar22._8_4_ = auVar88._12_4_;
    auVar22._12_4_ = auVar88._12_4_;
    auVar23._0_8_ =
         (ulong)uVar96 * (ulong)auVar88._0_4_ + *(long *)(puVar10 + (auVar88._0_8_ & 0xff0));
    auVar23._8_8_ =
         (auVar22._8_8_ & 0xffffffff) * (ulong)auVar88._8_4_ +
         *(long *)((long)(puVar10 + (auVar88._0_8_ & 0xff0)) + 8);
    auVar23 = auVar23 ^ *(undefined1 (*) [16])(puVar7 + (auVar88._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar107._4_4_;
    auVar54._4_4_ = uVar96;
    auVar54._0_4_ = uVar96;
    auVar54._8_4_ = auVar107._12_4_;
    auVar54._12_4_ = auVar107._12_4_;
    auVar55._0_8_ =
         (ulong)uVar96 * (ulong)auVar107._0_4_ + *(long *)(puVar10 + (auVar107._0_8_ & 0xff0));
    auVar55._8_8_ =
         (auVar54._8_8_ & 0xffffffff) * (ulong)auVar107._8_4_ +
         *(long *)((long)(puVar10 + (auVar107._0_8_ & 0xff0)) + 8);
    auVar55 = auVar55 ^ *(undefined1 (*) [16])(puVar7 + (auVar107._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar123._4_4_;
    auVar89._4_4_ = uVar96;
    auVar89._0_4_ = uVar96;
    auVar89._8_4_ = auVar123._12_4_;
    auVar89._12_4_ = auVar123._12_4_;
    auVar90._0_8_ =
         (ulong)uVar96 * (ulong)auVar123._0_4_ + *(long *)(puVar10 + (auVar123._0_8_ & 0xff0));
    auVar90._8_8_ =
         (auVar89._8_8_ & 0xffffffff) * (ulong)auVar123._8_4_ +
         *(long *)((long)(puVar10 + (auVar123._0_8_ & 0xff0)) + 8);
    auVar90 = auVar90 ^ *(undefined1 (*) [16])(puVar7 + (auVar123._0_8_ >> 0x20 & 0xff0));
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xc0) = auVar39;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xd0) = auVar23;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xe0) = auVar55;
    *(undefined1 (*) [16])(puVar12 + uVar11 + 0xf0) = auVar90;
    uVar96 = auVar39._4_4_;
    auVar71._4_4_ = uVar96;
    auVar71._0_4_ = uVar96;
    auVar71._8_4_ = auVar39._12_4_;
    auVar71._12_4_ = auVar39._12_4_;
    auVar58._0_8_ =
         (ulong)uVar96 * (ulong)auVar39._0_4_ + *(long *)(puVar10 + (auVar39._0_8_ & 0xff0));
    auVar58._8_8_ =
         (auVar71._8_8_ & 0xffffffff) * (ulong)auVar39._8_4_ +
         *(long *)((long)(puVar10 + (auVar39._0_8_ & 0xff0)) + 8);
    auVar58 = auVar58 ^ *(undefined1 (*) [16])(puVar7 + (auVar39._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar23._4_4_;
    auVar40._4_4_ = uVar96;
    auVar40._0_4_ = uVar96;
    auVar40._8_4_ = auVar23._12_4_;
    auVar40._12_4_ = auVar23._12_4_;
    auVar25._0_8_ =
         (ulong)uVar96 * (ulong)auVar23._0_4_ + *(long *)(puVar10 + (auVar23._0_8_ & 0xff0));
    auVar25._8_8_ =
         (auVar40._8_8_ & 0xffffffff) * (ulong)auVar23._8_4_ +
         *(long *)((long)(puVar10 + (auVar23._0_8_ & 0xff0)) + 8);
    auVar25 = auVar25 ^ *(undefined1 (*) [16])(puVar7 + (auVar23._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar55._4_4_;
    auVar24._4_4_ = uVar96;
    auVar24._0_4_ = uVar96;
    auVar24._8_4_ = auVar55._12_4_;
    auVar24._12_4_ = auVar55._12_4_;
    auVar13._0_8_ =
         (ulong)uVar96 * (ulong)auVar55._0_4_ + *(long *)(puVar10 + (auVar55._0_8_ & 0xff0));
    auVar13._8_8_ =
         (auVar24._8_8_ & 0xffffffff) * (ulong)auVar55._8_4_ +
         *(long *)((long)(puVar10 + (auVar55._0_8_ & 0xff0)) + 8);
    auVar13 = auVar13 ^ *(undefined1 (*) [16])(puVar7 + (auVar55._0_8_ >> 0x20 & 0xff0));
    uVar96 = auVar90._4_4_;
    auVar56._4_4_ = uVar96;
    auVar56._0_4_ = uVar96;
    auVar56._8_4_ = auVar90._12_4_;
    auVar56._12_4_ = auVar90._12_4_;
    auVar41._0_8_ =
         (ulong)uVar96 * (ulong)auVar90._0_4_ + *(long *)(puVar10 + (auVar90._0_8_ & 0xff0));
    auVar41._8_8_ =
         (auVar56._8_8_ & 0xffffffff) * (ulong)auVar90._8_4_ +
         *(long *)((long)(puVar10 + (auVar90._0_8_ & 0xff0)) + 8);
    auVar41 = auVar41 ^ *(undefined1 (*) [16])(puVar7 + (auVar90._0_8_ >> 0x20 & 0xff0));
    sVar8 = (size_t)((int)sVar8 + 0x200U & 0xff0);
    if (r * 2 - 2 <= uVar9) break;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x30) = auVar58;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x20) = auVar25;
    *(undefined1 (*) [16])((long)Bout + lVar6 + -0x10) = auVar13;
    *(undefined1 (*) [16])((long)Bout + lVar6) = auVar41;
    uVar9 = uVar9 + 2;
    lVar6 = lVar6 + 0x80;
    puVar5 = puVar12;
    puVar12 = puVar10;
  }
  ctx->S0 = puVar12;
  ctx->S1 = puVar10;
  ctx->S2 = puVar7;
  ctx->w = sVar8;
  iVar57 = auVar58._0_4_;
  uVar96 = auVar41._0_4_ + iVar57;
  iVar72 = auVar58._4_4_;
  uVar110 = auVar41._4_4_ + iVar72;
  iVar73 = auVar58._8_4_;
  uVar111 = auVar41._8_4_ + iVar73;
  iVar74 = auVar58._12_4_;
  uVar112 = auVar41._12_4_ + iVar74;
  auVar91._0_4_ = uVar96 >> 0x19;
  auVar91._4_4_ = uVar110 >> 0x19;
  auVar91._8_4_ = uVar111 >> 0x19;
  auVar91._12_4_ = uVar112 >> 0x19;
  auVar108._0_4_ = uVar96 * 0x80;
  auVar108._4_4_ = uVar110 * 0x80;
  auVar108._8_4_ = uVar111 * 0x80;
  auVar108._12_4_ = uVar112 * 0x80;
  auVar76 = (auVar108 | auVar91) ^ auVar25;
  uVar113 = auVar76._0_4_;
  uVar127 = auVar76._4_4_;
  uVar128 = auVar76._8_4_;
  uVar130 = auVar76._12_4_;
  auVar92._0_4_ = uVar113 + iVar57 >> 0x17;
  auVar92._4_4_ = uVar127 + iVar72 >> 0x17;
  auVar92._8_4_ = uVar128 + iVar73 >> 0x17;
  auVar92._12_4_ = uVar130 + iVar74 >> 0x17;
  auVar124._0_4_ = (uVar113 + iVar57) * 0x200;
  auVar124._4_4_ = (uVar127 + iVar72) * 0x200;
  auVar124._8_4_ = (uVar128 + iVar73) * 0x200;
  auVar124._12_4_ = (uVar130 + iVar74) * 0x200;
  auVar97 = (auVar124 | auVar92) ^ auVar13;
  iVar75 = auVar97._0_4_;
  iVar95 = auVar97._4_4_;
  uVar96 = auVar97._8_4_ + uVar128;
  uVar110 = auVar97._12_4_ + uVar130;
  auVar135._0_4_ = iVar75 + uVar113 >> 0x13;
  auVar135._4_4_ = iVar95 + uVar127 >> 0x13;
  auVar135._8_4_ = uVar96 >> 0x13;
  auVar135._12_4_ = uVar110 >> 0x13;
  auVar93._0_4_ = (iVar75 + uVar113) * 0x2000;
  auVar93._4_4_ = (iVar95 + uVar127) * 0x2000;
  auVar93._8_4_ = uVar96 * 0x2000;
  auVar93._12_4_ = uVar110 * 0x2000;
  auVar76 = (auVar93 | auVar135) ^ auVar41;
  auVar138._0_12_ = auVar76._4_12_;
  auVar138._12_4_ = auVar76._0_4_;
  uVar96 = auVar76._0_4_ + iVar75;
  uVar110 = auVar76._4_4_ + iVar95;
  uVar111 = auVar76._8_4_ + auVar97._8_4_;
  uVar112 = auVar76._12_4_ + auVar97._12_4_;
  auVar136._0_4_ = uVar96 >> 0xe;
  auVar136._4_4_ = uVar110 >> 0xe;
  auVar136._8_4_ = uVar111 >> 0xe;
  auVar136._12_4_ = uVar112 >> 0xe;
  auVar94._0_4_ = uVar96 * 0x40000;
  auVar94._4_4_ = uVar110 * 0x40000;
  auVar94._8_4_ = uVar111 * 0x40000;
  auVar94._12_4_ = uVar112 * 0x40000;
  auVar125._0_8_ = auVar97._8_8_;
  auVar125._8_4_ = iVar75;
  auVar125._12_4_ = iVar95;
  auVar58 = (auVar94 | auVar136) ^ auVar58;
  uVar96 = uVar130 + auVar58._0_4_;
  uVar110 = uVar113 + auVar58._4_4_;
  uVar111 = uVar127 + auVar58._8_4_;
  uVar112 = uVar128 + auVar58._12_4_;
  auVar143._0_4_ = uVar96 * 0x80;
  auVar143._4_4_ = uVar110 * 0x80;
  auVar143._8_4_ = uVar111 * 0x80;
  auVar143._12_4_ = uVar112 * 0x80;
  auVar109._0_4_ = uVar96 >> 0x19;
  auVar109._4_4_ = uVar110 >> 0x19;
  auVar109._8_4_ = uVar111 >> 0x19;
  auVar109._12_4_ = uVar112 >> 0x19;
  auVar109 = auVar109 ^ auVar143 ^ auVar138;
  iVar137 = auVar109._0_4_;
  uVar96 = iVar137 + auVar58._0_4_;
  iVar140 = auVar109._4_4_;
  uVar110 = iVar140 + auVar58._4_4_;
  iVar141 = auVar109._8_4_;
  iVar142 = auVar109._12_4_;
  uVar111 = iVar141 + auVar58._8_4_;
  uVar112 = iVar142 + auVar58._12_4_;
  auVar144._0_4_ = uVar96 * 0x200;
  auVar144._4_4_ = uVar110 * 0x200;
  auVar144._8_4_ = uVar111 * 0x200;
  auVar144._12_4_ = uVar112 * 0x200;
  auVar139._0_4_ = uVar96 >> 0x17;
  auVar139._4_4_ = uVar110 >> 0x17;
  auVar139._8_4_ = uVar111 >> 0x17;
  auVar139._12_4_ = uVar112 >> 0x17;
  auVar139 = auVar139 ^ auVar144 ^ auVar125;
  iVar75 = auVar139._0_4_;
  iVar95 = auVar139._4_4_;
  iVar129 = auVar139._8_4_;
  iVar131 = auVar139._12_4_;
  uVar130 = ((iVar75 + iVar137) * 0x2000 | (uint)(iVar75 + iVar137) >> 0x13) ^ uVar130;
  uVar113 = ((iVar95 + iVar140) * 0x2000 | (uint)(iVar95 + iVar140) >> 0x13) ^ uVar113;
  uVar127 = ((iVar129 + iVar141) * 0x2000 | (uint)(iVar129 + iVar141) >> 0x13) ^ uVar127;
  uVar128 = ((iVar131 + iVar142) * 0x2000 | (uint)(iVar131 + iVar142) >> 0x13) ^ uVar128;
  uVar96 = uVar130 + iVar75;
  uVar110 = uVar113 + iVar95;
  uVar111 = uVar127 + iVar129;
  uVar112 = uVar128 + iVar131;
  auVar145._0_4_ = uVar96 >> 0xe;
  auVar145._4_4_ = uVar110 >> 0xe;
  auVar145._8_4_ = uVar111 >> 0xe;
  auVar145._12_4_ = uVar112 >> 0xe;
  auVar126._0_4_ = uVar96 * 0x40000;
  auVar126._4_4_ = uVar110 * 0x40000;
  auVar126._8_4_ = uVar111 * 0x40000;
  auVar126._12_4_ = uVar112 * 0x40000;
  auVar58 = (auVar126 | auVar145) ^ auVar58;
  uVar114 = auVar58._0_4_ + iVar57;
  puVar3 = (uint32_t *)((long)Bout + lVar6 + -0x30);
  *puVar3 = uVar114;
  puVar3[1] = auVar58._4_4_ + iVar72;
  puVar3[2] = auVar58._8_4_ + iVar73;
  puVar3[3] = auVar58._12_4_ + iVar74;
  piVar4 = (int *)((long)Bout + lVar6 + -0x20);
  *piVar4 = uVar113 + auVar25._0_4_;
  piVar4[1] = uVar127 + auVar25._4_4_;
  piVar4[2] = uVar128 + auVar25._8_4_;
  piVar4[3] = uVar130 + auVar25._12_4_;
  piVar4 = (int *)((long)Bout + lVar6 + -0x10);
  *piVar4 = iVar129 + auVar13._0_4_;
  piVar4[1] = iVar131 + auVar13._4_4_;
  piVar4[2] = iVar75 + auVar13._8_4_;
  piVar4[3] = iVar95 + auVar13._12_4_;
  piVar4 = (int *)((long)Bout + lVar6);
  *piVar4 = iVar142 + auVar41._0_4_;
  piVar4[1] = iVar137 + auVar41._4_4_;
  piVar4[2] = iVar140 + auVar41._8_4_;
  piVar4[3] = iVar141 + auVar41._12_4_;
  return uVar114;
}

Assistant:

static uint32_t
blockmix_xor_save(const salsa20_blk_t *restrict Bin1,
    salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r, pwxform_ctx_t *restrict ctx)
{
	__m128i X0, X1, X2, X3, Y0, Y1, Y2, Y3;
	uint8_t *S0 = ctx->S0, *S1 = ctx->S1, *S2 = ctx->S2;
	size_t w = ctx->w;
	size_t i;

	/* Convert 128-byte blocks to 64-byte blocks */
	/* 1: r_1 <-- 128r / PWXbytes */
	r *= 2;

	r--;
	PREFETCH(&Bin2[r], _MM_HINT_T0)
	PREFETCH(&Bin1[r], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i], _MM_HINT_T0)
		PREFETCH(&Bin1[i], _MM_HINT_T0)
	}

	/* 2: X <-- B'_{r_1 - 1} */
	XOR4_2(Bin1[r].q, Bin2[r].q)

	/* 3: for i = 0 to r_1 - 1 do */
	i = 0;
	r--;
	do {
		XOR4(Bin1[i].q, Bin2[i].q)
		/* 5: X <-- X \xor B'_i */
		XOR4_Y
		/* 7: X <-- pwxform(X) */
		PWXFORM
		/* 8: B'_i <-- X */
		OUT(Bout[i].q)

		XOR4(Bin1[i + 1].q, Bin2[i + 1].q)
		/* 5: X <-- X \xor B'_i */
		XOR4_Y
		/* 7: X <-- pwxform(X) */
		PWXFORM

		if (unlikely(i >= r))
			break;

		/* 8: B'_i <-- X */
		OUT(Bout[i + 1].q)

		i += 2;
	} while (1);
	i++;

	ctx->S0 = S0; ctx->S1 = S1; ctx->S2 = S2;
	ctx->w = w;

	/* 11: B_i <-- H(B_i) */
	SALSA20_2(Bout[i].q)

	return _mm_cvtsi128_si32(X0);
}